

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_entropy.c
# Opt level: O2

double * inform_local_transfer_entropy
                   (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,double *te
                   ,inform_error *err)

{
  long lVar1;
  _Bool _Var2;
  double *__ptr;
  void *__ptr_00;
  int *__ptr_01;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  int *piVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  int *local_a8;
  int *local_88;
  
  _Var2 = check_arguments(src,dst,back,l,n,m,b,k,err);
  if (!_Var2) {
    lVar5 = m - k;
    lVar19 = lVar5 * n;
    __ptr = te;
    if ((te != (double *)0x0) || (__ptr = (double *)malloc(lVar19 * 8), __ptr != (double *)0x0)) {
      auVar25._8_4_ = (int)(k >> 0x20);
      auVar25._0_8_ = k;
      auVar25._12_4_ = 0x45300000;
      dVar23 = pow((double)b,
                   (auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      dVar24 = pow((double)b,
                   ((double)CONCAT44(0x45300000,(int)(l >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)l) - 4503599627370496.0));
      lVar6 = ((long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24) *
              ((long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f | (long)dVar23);
      lVar20 = (ulong)(uint)(b * b) * lVar6;
      __ptr_00 = calloc(lVar20 + lVar6 + b * lVar6 * 2,4);
      if (__ptr_00 != (void *)0x0) {
        __ptr_01 = (int *)malloc(lVar19 * 0x10);
        if (__ptr_01 != (int *)0x0) {
          lVar1 = lVar6 * 4 + lVar20 * 4;
          lVar6 = b * lVar6 * 4 + lVar1;
          piVar3 = __ptr_01 + lVar19;
          local_a8 = piVar3 + lVar19;
          piVar4 = local_a8 + lVar19;
          piVar7 = back + (k - 1);
          piVar17 = __ptr_01;
          local_88 = src;
          for (sVar14 = 0; sVar14 != n; sVar14 = sVar14 + 1) {
            *piVar3 = 0;
            iVar10 = 0;
            iVar9 = 1;
            for (sVar15 = 0; piVar8 = piVar7, sVar21 = k, k != sVar15; sVar15 = sVar15 + 1) {
              iVar9 = iVar9 * b;
              iVar10 = iVar10 * b + dst[sVar15];
              *piVar3 = iVar10;
            }
            while (sVar21 < m) {
              iVar10 = 0;
              piVar13 = piVar8;
              sVar15 = l;
              while (bVar22 = sVar15 != 0, sVar15 = sVar15 - 1, bVar22) {
                iVar10 = iVar10 * b + *piVar13;
                piVar13 = piVar13 + m * n;
              }
              lVar16 = sVar21 - k;
              iVar11 = iVar10 * iVar9 + piVar3[lVar16];
              piVar3[lVar16] = iVar11;
              iVar12 = local_88[sVar21 - 1];
              iVar11 = iVar11 * b + dst[sVar21];
              piVar4[lVar16] = iVar11;
              piVar17[lVar16] = iVar11 * b + iVar12;
              iVar12 = piVar3[lVar16] * b + iVar12;
              local_a8[lVar16] = iVar12;
              piVar13 = (int *)((long)__ptr_00 + (long)piVar17[lVar16] * 4);
              *piVar13 = *piVar13 + 1;
              piVar13 = (int *)((long)__ptr_00 + (long)piVar3[lVar16] * 4 + lVar20 * 4);
              *piVar13 = *piVar13 + 1;
              piVar13 = (int *)((long)__ptr_00 + (long)iVar12 * 4 + lVar1);
              *piVar13 = *piVar13 + 1;
              iVar12 = piVar4[lVar16];
              piVar13 = (int *)((long)__ptr_00 + (long)iVar12 * 4 + lVar6);
              *piVar13 = *piVar13 + 1;
              if (sVar21 + 1 != m) {
                piVar3[lVar16 + 1] = iVar12 - (iVar10 * b + dst[lVar16]) * iVar9;
              }
              piVar8 = piVar8 + 1;
              sVar21 = sVar21 + 1;
            }
            local_88 = local_88 + m;
            dst = dst + m;
            piVar17 = piVar17 + lVar5;
            piVar3 = piVar3 + lVar5;
            local_a8 = local_a8 + lVar5;
            piVar4 = piVar4 + lVar5;
            piVar7 = piVar7 + n;
          }
          lVar5 = lVar5 * n;
          pdVar18 = __ptr;
          piVar3 = __ptr_01;
          while (bVar22 = lVar19 != 0, lVar19 = lVar19 + -1, bVar22) {
            dVar23 = log2(((double)*(uint *)((long)__ptr_00 + (long)piVar3[lVar5] * 4 + lVar20 * 4)
                          * (double)*(uint *)((long)__ptr_00 + (long)*piVar3 * 4)) /
                          ((double)*(uint *)((long)__ptr_00 + (long)piVar3[lVar5 * 3] * 4 + lVar6) *
                          (double)*(uint *)((long)__ptr_00 + (long)piVar3[lVar5 * 2] * 4 + lVar1)));
            *pdVar18 = dVar23;
            piVar3 = piVar3 + 1;
            pdVar18 = pdVar18 + 1;
          }
          free(__ptr_01);
          free(__ptr_00);
          return __ptr;
        }
        if (te == (double *)0x0) {
          free(__ptr);
        }
        free(__ptr_00);
      }
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_transfer_entropy(int const *src, int const *dst,
    int const *back, size_t l, size_t n, size_t m, int b, size_t k, double *te,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate = (te == NULL);
    if (allocate)
    {
        te = malloc(N * sizeof(double));
        if (te == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const q = (size_t) pow((double) b, (double) k);
    size_t const r = (size_t) pow((double) b, (double) l);
    size_t const states_size     = b*b*q*r;
    size_t const histories_size  = q*r;
    size_t const sources_size    = b*q*r;
    size_t const predicates_size = b*q*r;
    size_t const total_size = states_size + histories_size + sources_size + predicates_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states     = { histogram_data, states_size, N };
    inform_dist histories  = { histogram_data + states_size, histories_size, N };
    inform_dist sources    = { histogram_data + states_size + histories_size, sources_size, N };
    inform_dist predicates = { histogram_data + states_size + histories_size + sources_size, predicates_size, N };

    int *state_data = malloc(4 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate) free(te);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state     = state_data;
    int *history   = state + N;
    int *source    = history + N;
    int *predicate = source + N;

    accumulate_local_observations(src, dst, back, l, n, m, b, k, &states,
        &histories, &sources, &predicates, state, history, source, predicate);

    double s, t, u, v;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        t = sources.histogram[source[i]];
        u = predicates.histogram[predicate[i]];
        v = histories.histogram[history[i]];
        te[i] = log2((s*v)/(t*u));
    }

    free(state_data);
    free(histogram_data);

    return te;
}